

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O2

bool __thiscall
fmt::v11::basic_format_arg<fmt::v11::context>::format_custom
          (basic_format_arg<fmt::v11::context> *this,char_type *parse_begin,
          parse_context<char> *parse_ctx,context *ctx)

{
  size_t *psVar1;
  type tVar2;
  char *pcVar3;
  
  tVar2 = this->type_;
  if (tVar2 == custom_type) {
    pcVar3 = (parse_ctx->fmt_).data_;
    (parse_ctx->fmt_).data_ = parse_begin;
    psVar1 = &(parse_ctx->fmt_).size_;
    *psVar1 = (size_t)(pcVar3 + (*psVar1 - (long)parse_begin));
    (*(this->value_).field_0.custom.format)
              ((void *)(this->value_).field_0.long_long_value,parse_ctx,ctx);
  }
  return tVar2 == custom_type;
}

Assistant:

auto format_custom(const char_type* parse_begin,
                     parse_context<char_type>& parse_ctx, Context& ctx)
      -> bool {
    if (type_ != detail::type::custom_type) return false;
    parse_ctx.advance_to(parse_begin);
    value_.custom.format(value_.custom.value, parse_ctx, ctx);
    return true;
  }